

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2obs.cpp
# Opt level: O1

void PrintResults(CEExecOptions *inputs,CESkyCoord *obs_coords,CESkyCoord *obs_cirs_coords,
                 CEAngle *hour_angle)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  CEAngle aCStack_78 [16];
  string local_68 [2];
  
  putchar(10);
  puts("******************************************");
  puts("* Results of CIRS -> Observed conversion *");
  puts("******************************************");
  puts("Observed Coordinates (output)");
  CEDate::CEDate((CEDate *)local_68,2451545.0,JD);
  (**(code **)(*(long *)obs_coords + 0x18))(aCStack_78,obs_coords,local_68);
  CEAngle::Deg();
  printf("    Azimuth        : %f degrees\n");
  CEAngle::~CEAngle(aCStack_78);
  CEDate::~CEDate((CEDate *)local_68);
  CEDate::CEDate((CEDate *)local_68,2451545.0,JD);
  (**(code **)(*(long *)obs_coords + 0x20))(aCStack_78,obs_coords,local_68);
  CEAngle::Deg();
  printf("    Zenith         : %+f degrees\n");
  CEAngle::~CEAngle(aCStack_78);
  CEDate::~CEDate((CEDate *)local_68);
  CEDate::CEDate((CEDate *)local_68,2451545.0,JD);
  (**(code **)(*(long *)obs_coords + 0x20))(aCStack_78,obs_coords,local_68);
  dVar2 = (double)CEAngle::Deg();
  printf("    Altitude       : %+f degrees\n",90.0 - dVar2);
  CEAngle::~CEAngle(aCStack_78);
  CEDate::~CEDate((CEDate *)local_68);
  puts("CIRS Coordinates (input)");
  paVar1 = &local_68[0].field_2;
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"ra","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Right Ascension: %f degrees\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"dec","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Declination    : %+f degrees\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"juliandate","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Julian Date    : %f\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  puts("Apparent CIRS Coordinates");
  CEDate::CEDate((CEDate *)local_68,2451545.0,JD);
  (**(code **)(*(long *)obs_cirs_coords + 0x18))(aCStack_78,obs_cirs_coords,local_68);
  CEAngle::Deg();
  printf("    Right Ascension: %f\n");
  CEAngle::~CEAngle(aCStack_78);
  CEDate::~CEDate((CEDate *)local_68);
  CEDate::CEDate((CEDate *)local_68,2451545.0,JD);
  (**(code **)(*(long *)obs_cirs_coords + 0x20))(aCStack_78,obs_cirs_coords,local_68);
  CEAngle::Deg();
  printf("    Declination    : %+f\n");
  CEAngle::~CEAngle(aCStack_78);
  CEDate::~CEDate((CEDate *)local_68);
  CEAngle::Deg();
  printf("    Hour Angle     : %+f\n");
  puts("Observer Info");
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"longitude","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Longitude      : %f deg\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"latitude","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Latitude       : %+f deg\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"elevation","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Elevation      : %f meters\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"pressure","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Pressure       : %f hPa\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"temperature","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Temperature    : %f Celsius\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  local_68[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"humidity","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_68);
  printf("    Relative Humid.: %f\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_68[0]._M_dataplus._M_p);
  }
  putchar(10);
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& obs_coords,
                  const CESkyCoord& obs_cirs_coords,
                  const CEAngle&    hour_angle)
{
    std::printf("\n") ;
    std::printf("******************************************\n");
    std::printf("* Results of CIRS -> Observed conversion *\n");
    std::printf("******************************************\n");
    std::printf("Observed Coordinates (output)\n");
    std::printf("    Azimuth        : %f degrees\n", obs_coords.XCoord().Deg());
    std::printf("    Zenith         : %+f degrees\n", obs_coords.YCoord().Deg());
    std::printf("    Altitude       : %+f degrees\n", 90.0-obs_coords.YCoord().Deg());
    std::printf("CIRS Coordinates (input)\n");
    std::printf("    Right Ascension: %f degrees\n", inputs.AsDouble("ra"));
    std::printf("    Declination    : %+f degrees\n", inputs.AsDouble("dec"));
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate"));
    std::printf("Apparent CIRS Coordinates\n");
    std::printf("    Right Ascension: %f\n", obs_cirs_coords.XCoord().Deg());
    std::printf("    Declination    : %+f\n", obs_cirs_coords.YCoord().Deg());
    std::printf("    Hour Angle     : %+f\n", hour_angle.Deg());
    std::printf("Observer Info\n");
    std::printf("    Longitude      : %f deg\n", inputs.AsDouble("longitude"));
    std::printf("    Latitude       : %+f deg\n", inputs.AsDouble("latitude"));
    std::printf("    Elevation      : %f meters\n", inputs.AsDouble("elevation"));
    std::printf("    Pressure       : %f hPa\n", inputs.AsDouble("pressure"));
    std::printf("    Temperature    : %f Celsius\n", inputs.AsDouble("temperature"));
    std::printf("    Relative Humid.: %f\n", inputs.AsDouble("humidity"));
    std::printf("\n");
}